

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

HelicsInput helicsFederateGetInputByTarget(HelicsFederate fed,char *target,HelicsError *err)

{
  string_view target_00;
  bool bVar1;
  element_type *this;
  HelicsError *in_RDX;
  long in_RSI;
  Input *in_stack_00000030;
  Input *input;
  shared_ptr<helics::ValueFederate> fedObj;
  ValueFederate *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  HelicsError *in_stack_ffffffffffffff90;
  HelicsFederate in_stack_ffffffffffffff98;
  __shared_ptr local_30 [16];
  HelicsError *local_20;
  long local_18;
  HelicsInput local_8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  getValueFedSharedPtr(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_30);
  if (bVar1) {
    if (local_18 == 0) {
      assignError(local_20,-4,"The supplied string argument is null and therefore invalid");
      local_8 = (HelicsInput)0x0;
    }
    else {
      this = std::
             __shared_ptr_access<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1ce1c7);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)this,
                 (char *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      target_00._M_len._7_1_ = in_stack_ffffffffffffff8f;
      target_00._M_len._0_7_ = in_stack_ffffffffffffff88;
      target_00._M_str = (char *)this;
      helics::ValueFederate::getInputByTarget(in_stack_ffffffffffffff80,target_00);
      bVar1 = helics::Interface::isValid((Interface *)0x1ce20a);
      if (bVar1) {
        local_8 = anon_unknown.dwarf_5d1c2::findOrCreateInput(input,in_stack_00000030);
      }
      else {
        assignError(local_20,-4,"the specified input target is a not a recognized");
        local_8 = (HelicsInput)0x0;
      }
    }
  }
  else {
    local_8 = (HelicsInput)0x0;
  }
  std::shared_ptr<helics::ValueFederate>::~shared_ptr((shared_ptr<helics::ValueFederate> *)0x1ce2be)
  ;
  return local_8;
}

Assistant:

HelicsInput helicsFederateGetInputByTarget(HelicsFederate fed, const char* target, HelicsError* err)
{
    auto fedObj = getValueFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }
    CHECK_NULL_STRING(target, nullptr);
    try {
        auto& input = fedObj->getInputByTarget(target);
        if (!input.isValid()) {
            assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidTargetKey);
            return nullptr;
        }
        return findOrCreateInput(fed, input);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
    // LCOV_EXCL_STOP
}